

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatHelpers.cpp
# Opt level: O0

bool slang::ast::FmtHelpers::checkSFormatArgs(ASTContext *context,Args *args)

{
  Expression *pEVar1;
  Args *context_00;
  bool bVar2;
  iterator ppEVar3;
  StringLiteral *arg_00;
  Expression *pEVar4;
  Expression *arg;
  iterator argIt;
  Args *args_local;
  ASTContext *context_local;
  
  argIt = (iterator)args;
  args_local = (Args *)context;
  ppEVar3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            begin(args);
  context_00 = args_local;
  arg = (Expression *)(ppEVar3 + 1);
  if ((*ppEVar3)->kind == StringLiteral) {
    arg_00 = Expression::as<slang::ast::StringLiteral>(*ppEVar3);
    ppEVar3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
              end((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)argIt);
    bVar2 = checkFormatString((ASTContext *)context_00,arg_00,(iterator *)&arg,ppEVar3);
    pEVar1 = arg;
    if (bVar2) {
      pEVar4 = (Expression *)
               nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>
               ::end((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)argIt);
      if (pEVar1 == pEVar4) {
        context_local._7_1_ = true;
      }
      else {
        ASTContext::addDiag((ASTContext *)args_local,(DiagCode)0x15000b,
                            *(SourceRange *)(*(long *)arg + 0x20));
        context_local._7_1_ = false;
      }
    }
    else {
      context_local._7_1_ = false;
    }
  }
  else {
    context_local._7_1_ = true;
  }
  return context_local._7_1_;
}

Assistant:

bool FmtHelpers::checkSFormatArgs(const ASTContext& context, const Args& args) {
    // If the format string is known at compile time, check it for correctness now.
    // Otherwise this will wait until runtime.
    auto argIt = args.begin();
    auto arg = *argIt++;
    if (arg->kind != ExpressionKind::StringLiteral)
        return true;

    if (!checkFormatString(context, arg->as<StringLiteral>(), argIt, args.end()))
        return false;

    // Leftover arguments are invalid (all must be consumed by the format string).
    if (argIt != args.end()) {
        context.addDiag(diag::FormatTooManyArgs, (*argIt)->sourceRange);
        return false;
    }

    return true;
}